

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O2

void RunningLights(byte red,byte green,byte blue,int WaveDelay)

{
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  int iVar1;
  int iVar2;
  int i;
  int ledIndex;
  double dVar3;
  double dVar4;
  double dVar5;
  
  iVar1 = 0;
  iVar2 = 1;
  while (iVar1 != 0x30) {
    iVar1 = iVar1 + 1;
    for (ledIndex = 0; ledIndex != 0x18; ledIndex = ledIndex + 1) {
      dVar3 = (double)(ledIndex + iVar2);
      dVar4 = sin(dVar3);
      dVar5 = sin(dVar3);
      dVar3 = sin(dVar3);
      setPixel(ledIndex,(uchar)(int)(((dVar4 * 127.0 + 128.0) / 255.0) *
                                    (double)(int)CONCAT71(in_register_00000039,red)),
               (uchar)(int)(((dVar5 * 127.0 + 128.0) / 255.0) *
                           (double)(int)CONCAT71(in_register_00000031,green)),
               (uchar)(int)(((dVar3 * 127.0 + 128.0) / 255.0) *
                           (double)(int)CONCAT71(in_register_00000011,blue)));
    }
    showStrip();
    delay(WaveDelay);
    iVar2 = iVar2 + 1;
  }
  return;
}

Assistant:

void RunningLights(byte red, byte green, byte blue, int WaveDelay) {
    int Position=0;

    for(int j=0; j<NUM_LEDS*2; j++)
    {
        Position++;
        for(int i=0; i<NUM_LEDS; i++) {
            setPixel(i,((sin(i+Position) * 127 + 128)/255)*red,
                     ((sin(i+Position) * 127 + 128)/255)*green,
                     ((sin(i+Position) * 127 + 128)/255)*blue);
        }

        showStrip();
        delay(WaveDelay);
    }
}